

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O0

void lore_append_spell_clause
               (textblock *tb,bitflag *f,_Bool know_hp,monster_race *race,char *conjunction,
               char *end)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  int iVar5;
  char *pcVar6;
  wchar_t damage;
  wchar_t color;
  wchar_t spell;
  _Bool comma;
  wchar_t count;
  char *end_local;
  char *conjunction_local;
  monster_race *race_local;
  _Bool know_hp_local;
  bitflag *f_local;
  textblock *tb_local;
  
  iVar1 = flag_count(f,0xd);
  if (iVar1 != 0) {
    for (damage = flag_next(f,0xd,1); damage != L'\0'; damage = flag_next(f,0xd,damage + L'\x01')) {
      wVar2 = spell_color(player,race,damage);
      wVar3 = mon_spell_lore_damage(damage,race,know_hp);
      wVar4 = flag_next(f,0xd,1);
      if (damage != wVar4) {
        if (2 < iVar1) {
          textblock_append(tb,",");
        }
        iVar5 = flag_next(f,0xd,damage + L'\x01');
        if (iVar5 == 0) {
          textblock_append(tb," ");
          textblock_append(tb,"%s",conjunction);
        }
        textblock_append(tb," ");
      }
      pcVar6 = mon_spell_lore_description(damage,race);
      textblock_append_c(tb,(uint8_t)wVar2,"%s",pcVar6);
      if (L'\0' < wVar3) {
        textblock_append_c(tb,(uint8_t)wVar2," (%d)",(ulong)(uint)wVar3);
      }
    }
    textblock_append(tb,"%s",end);
  }
  return;
}

Assistant:

static void lore_append_spell_clause(textblock *tb, bitflag *f, bool know_hp,
									 const struct monster_race *race,
									 const char *conjunction,
									 const char *end)
{
	int count = rsf_count(f);
	bool comma = count > 2;

	if (count) {
		int spell;
		for (spell = rsf_next(f, FLAG_START); spell;
			 spell = rsf_next(f, spell + 1)) {
			int color = spell_color(player, race, spell);
			int damage = mon_spell_lore_damage(spell, race, know_hp);

			/* First entry starts immediately */
			if (spell != rsf_next(f, FLAG_START)) {
				if (comma) {
					textblock_append(tb, ",");
				}
				/* Last entry */
				if (rsf_next(f, spell + 1) == FLAG_END) {
					textblock_append(tb, " ");
					textblock_append(tb, "%s", conjunction);
				}
				textblock_append(tb, " ");
			}
			textblock_append_c(tb, color, "%s",
							   mon_spell_lore_description(spell, race));
			if (damage > 0) {
				textblock_append_c(tb, color, " (%d)", damage);
			}
		}
		textblock_append(tb, "%s", end);
	}
}